

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_SGIX_list_priority(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_SGIX_list_priority != 0) {
    glad_glGetListParameterfvSGIX =
         (PFNGLGETLISTPARAMETERFVSGIXPROC)(*load)("glGetListParameterfvSGIX");
    glad_glGetListParameterivSGIX =
         (PFNGLGETLISTPARAMETERIVSGIXPROC)(*load)("glGetListParameterivSGIX");
    glad_glListParameterfSGIX = (PFNGLLISTPARAMETERFSGIXPROC)(*load)("glListParameterfSGIX");
    glad_glListParameterfvSGIX = (PFNGLLISTPARAMETERFVSGIXPROC)(*load)("glListParameterfvSGIX");
    glad_glListParameteriSGIX = (PFNGLLISTPARAMETERISGIXPROC)(*load)("glListParameteriSGIX");
    glad_glListParameterivSGIX = (PFNGLLISTPARAMETERIVSGIXPROC)(*load)("glListParameterivSGIX");
  }
  return;
}

Assistant:

static void load_GL_SGIX_list_priority(GLADloadproc load) {
	if(!GLAD_GL_SGIX_list_priority) return;
	glad_glGetListParameterfvSGIX = (PFNGLGETLISTPARAMETERFVSGIXPROC)load("glGetListParameterfvSGIX");
	glad_glGetListParameterivSGIX = (PFNGLGETLISTPARAMETERIVSGIXPROC)load("glGetListParameterivSGIX");
	glad_glListParameterfSGIX = (PFNGLLISTPARAMETERFSGIXPROC)load("glListParameterfSGIX");
	glad_glListParameterfvSGIX = (PFNGLLISTPARAMETERFVSGIXPROC)load("glListParameterfvSGIX");
	glad_glListParameteriSGIX = (PFNGLLISTPARAMETERISGIXPROC)load("glListParameteriSGIX");
	glad_glListParameterivSGIX = (PFNGLLISTPARAMETERIVSGIXPROC)load("glListParameterivSGIX");
}